

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_uuid.cpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::uuid_rule::string_value(uuid_rule *this,string *v)

{
  uuid *puVar1;
  undefined8 uVar2;
  bool bVar3;
  maybe<pstore::uuid,_void> *pmVar4;
  uuid *puVar5;
  error_category *extraout_RDX;
  error_code eVar6;
  maybe<pstore::uuid,_void> value;
  maybe<pstore::uuid,_void> local_29;
  
  pmVar4 = uuid::from_string(&local_29,v);
  bVar3 = local_29.valid_;
  eVar6._M_cat = extraout_RDX;
  eVar6._0_8_ = pmVar4;
  if (local_29.valid_ == true) {
    puVar5 = maybe<pstore::uuid,_void>::operator->(&local_29);
    puVar1 = (this->v_).ptr_;
    uVar2 = *(undefined8 *)((puVar5->data_)._M_elems + 8);
    *(undefined8 *)(puVar1->data_)._M_elems = *(undefined8 *)(puVar5->data_)._M_elems;
    *(undefined8 *)((puVar1->data_)._M_elems + 8) = uVar2;
    eVar6 = rule::pop(&this->super_rule);
  }
  if (local_29.valid_ == true) {
    local_29.valid_ = false;
  }
  if (bVar3 == false) {
    eVar6 = make_error_code(bad_uuid);
  }
  return eVar6;
}

Assistant:

std::error_code uuid_rule::string_value (std::string const & v) {
                if (maybe<uuid> const value = uuid::from_string (v)) {
                    *v_ = *value;
                    return pop ();
                }
                return error::bad_uuid;
            }